

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreCompare.cpp
# Opt level: O0

bool mathCore::is_CNF(expression *a)

{
  bool bVar1;
  reference ppeVar2;
  expression *child;
  iterator __end3;
  iterator __begin3;
  expSet *__range3;
  expression *a_local;
  
  bVar1 = is_var(a);
  if ((!bVar1) && (bVar1 = is_literal(a), !bVar1)) {
    bVar1 = is_and(a);
    if (!bVar1) {
      bVar1 = is_sum(a);
      return bVar1;
    }
    __end3 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                       (&a->contents);
    child = (expression *)
            std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                      (&a->contents);
    while( true ) {
      bVar1 = std::operator!=(&__end3,(_Self *)&child);
      if (!bVar1) {
        return true;
      }
      ppeVar2 = std::_Rb_tree_const_iterator<expression_*>::operator*(&__end3);
      bVar1 = is_sum(*ppeVar2);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<expression_*>::operator++(&__end3);
    }
    return false;
  }
  return true;
}

Assistant:

bool mathCore::is_CNF(expression* a) {
	// Conjunctive normal form, AKA product of sums
	if (is_var(a) || is_literal(a)) {
		return true;					// Again, just a literal is a CNF
	}
	else if (is_and(a)) {
		for (auto child : a->contents) {
			if (!(is_sum(child))) {		// All children must be sums
				return false;
			}
		}
		return true;	// All Children were sums!
	}
	else {
		return is_sum(a);
	}
}